

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_const_char_*>::operator()
          (make_exception<const_char_*,_const_char_*> *this,stringstream *msg,char *arg,char *args)

{
  make_exception<const_char_*> local_29;
  char *local_28;
  char *args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_const_char_*> *this_local;
  
  local_28 = args;
  args_local = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<const_char_*>::operator()(&local_29,(stringstream *)arg_local,local_28);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }